

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O1

CTransactionRef __thiscall
miniminer_tests::make_tx
          (miniminer_tests *this,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,
          size_t num_outputs)

{
  uchar *puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  uint uVar7;
  pointer pCVar8;
  long lVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  long in_FS_OFFSET;
  CTransactionRef CVar12;
  CMutableTransaction tx;
  CMutableTransaction local_98;
  uchar local_59;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_98);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&local_98.vin,
             ((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_98.vout,num_outputs);
  pCVar8 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar8) {
    lVar6 = 0;
    lVar9 = 0;
    uVar10 = 0;
    do {
      *(undefined4 *)
       ((long)(&((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar6) =
           *(undefined4 *)((long)(&pCVar8->hash + 1) + lVar9);
      puVar1 = (pCVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar9;
      uVar3 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (pCVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar9 + 0x10;
      uVar5 = *(undefined8 *)(puVar1 + 8);
      puVar2 = ((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar6 + 0x10;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 8) = uVar5;
      puVar1 = ((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar6;
      *(undefined8 *)puVar1 = uVar3;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      uVar10 = uVar10 + 1;
      pCVar8 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x24;
      lVar6 = lVar6 + 0x68;
    } while (uVar10 < (ulong)(((long)(inputs->
                                     super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 2)
                             * -0x71c71c71c71c71c7));
  }
  if (num_outputs != 0) {
    lVar6 = 8;
    do {
      local_58._16_8_ = 0;
      stack0xffffffffffffffc0 = 0;
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      local_58._8_8_ = 0;
      local_59 = '[';
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
                 &local_59);
      uVar7 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar7 = uStack_3c;
      }
      ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      if (uStack_3c < 0x1d) {
        ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      }
      local_59 = 0x87;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
                 (uchar *)((long)&ppVar11->_union + (long)(int)uVar7),&local_59);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)&(local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue + lVar6),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      if (0x1c < uStack_3c) {
        free((void *)local_58._0_8_);
        local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      }
      *(undefined8 *)
       ((long)local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -8) = 100000000;
      lVar6 = lVar6 + 0x28;
      num_outputs = num_outputs - 1;
    } while (num_outputs != 0);
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(CTransaction **)this,
             (allocator<CTransaction> *)local_58,&local_98);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_98.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_98.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  CVar12.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar12.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CTransactionRef)CVar12.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, size_t num_outputs)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(num_outputs);
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout = inputs[i];
    }
    for (size_t i = 0; i < num_outputs; ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        // The actual input and output values of these transactions don't really
        // matter, since all accounting will use the entries' cached fees.
        tx.vout[i].nValue = COIN;
    }
    return MakeTransactionRef(tx);
}